

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::v5::internal::
     parse_nonnegative_int<char,fmt::v5::formatter<std::chrono::duration<long,std::ratio<1l,1000000000l>>,char,void>::spec_handler&>
               (char **begin,char *end,spec_handler *eh)

{
  bool bVar1;
  uint uVar2;
  spec_handler *in_RDX;
  long in_RSI;
  long *in_RDI;
  uint big;
  uint max_int;
  uint value;
  uint local_4;
  
  if (*(char *)*in_RDI == '0') {
    *in_RDI = *in_RDI + 1;
    local_4 = 0;
  }
  else {
    local_4 = 0;
    uVar2 = std::numeric_limits<int>::max();
    do {
      if (uVar2 / 10 < local_4) {
        local_4 = uVar2 + 1;
        break;
      }
      local_4 = local_4 * 10 + *(char *)*in_RDI + -0x30;
      *in_RDI = *in_RDI + 1;
      bVar1 = false;
      if ((*in_RDI != in_RSI) && (bVar1 = false, '/' < *(char *)*in_RDI)) {
        bVar1 = *(char *)*in_RDI < ':';
      }
    } while (bVar1);
    if (uVar2 < local_4) {
      formatter<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_char,_void>::spec_handler
      ::on_error(in_RDX,(char *)CONCAT44(local_4,uVar2));
    }
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}